

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biftim(bifcxdef *ctx,int argc)

{
  long lVar1;
  uchar *puVar2;
  int in_ESI;
  long in_RDI;
  int typ;
  runsdef val;
  uchar *p;
  uchar ret [80];
  tm *tblock;
  time_t timer;
  uint in_stack_ffffffffffffff4c;
  runcxdef *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  runcxdef *in_stack_ffffffffffffff60;
  int local_94;
  undefined1 local_78 [88];
  tm *local_20;
  time_t local_18 [3];
  
  if (in_ESI == 1) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    in_stack_ffffffffffffff60 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    local_94 = (int)in_stack_ffffffffffffff60;
  }
  else {
    local_94 = 1;
  }
  if (local_94 == 1) {
    local_18[0] = time((time_t *)0x0);
    local_20 = localtime(local_18);
    local_20->tm_year = local_20->tm_year + 0x76c;
    local_20->tm_mon = local_20->tm_mon + 1;
    local_20->tm_wday = local_20->tm_wday + 1;
    local_20->tm_yday = local_20->tm_yday + 1;
    oswp2(local_78,0x2f);
    bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    puVar2 = bifputnum((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    *puVar2 = '\x01';
    oswp4s(puVar2 + 1,local_18[0]);
    runpush(in_stack_ffffffffffffff60,local_94,(runsdef *)in_stack_ffffffffffffff50);
  }
  else {
    if (local_94 != 2) {
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "gettime";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    os_get_sys_clock_ms();
    runpnum(in_stack_ffffffffffffff60,CONCAT44(local_94,in_stack_ffffffffffffff58));
  }
  return;
}

Assistant:

void biftim(bifcxdef *ctx, int argc)
{
    time_t     timer;
    struct tm *tblock;
    uchar      ret[80];
    uchar     *p;
    runsdef    val;
    int        typ;

    if (argc == 1)
    {
        /* get the time type */
        typ = (int)runpopnum(ctx->bifcxrun);
    }
    else
    {
        /* make sure no arguments are specified */
        bifcntargs(ctx, 0, argc);

        /* use the default time type */
        typ = 1;
    }

    switch(typ)
    {
    case 1:
        /* 
         *   default information format - list format with current system
         *   time and date 
         */

        /* make sure the time zone is set up properly */
        os_tzset();
        
        /* get the local time information */
        timer = time(NULL);
        tblock = localtime(&timer);
        
        /* adjust values for return format */
        tblock->tm_year += 1900;
        tblock->tm_mon++;
        tblock->tm_wday++;
        tblock->tm_yday++;
        
        /* build return list value */
        oswp2(ret, 47);
        p = ret + 2;
        p = bifputnum(p, tblock->tm_year);
        p = bifputnum(p, tblock->tm_mon);
        p = bifputnum(p, tblock->tm_mday);
        p = bifputnum(p, tblock->tm_wday);
        p = bifputnum(p, tblock->tm_yday);
        p = bifputnum(p, tblock->tm_hour);
        p = bifputnum(p, tblock->tm_min);
        p = bifputnum(p, tblock->tm_sec);
        *p++ = DAT_NUMBER;
        oswp4s(p, (long)timer);
        
        val.runstyp = DAT_LIST;
        val.runsv.runsvstr = ret;
        runpush(ctx->bifcxrun, DAT_LIST, &val);
        break;

    case 2:
        /*
         *   High-precision system timer value - returns the system time
         *   in milliseconds, relative to an arbitrary zero point 
         */
        runpnum(ctx->bifcxrun, os_get_sys_clock_ms());
        break;

    default:
        /* other types are invalid */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "gettime");
        break;
    }
}